

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

int sk_addrtype(SockAddr *addr)

{
  anon_enum_32 aVar1;
  int iVar2;
  
  aVar1 = addr->superfamily;
  if (UNIX < aVar1) {
    if (addr->ais == (addrinfo *)0x0) {
      aVar1 = IP;
    }
    else {
      aVar1 = addr->ais->ai_family;
    }
  }
  iVar2 = 1;
  if (aVar1 != IP) {
    iVar2 = (aVar1 != 10) + 2 + (uint)(aVar1 != 10);
  }
  return iVar2;
}

Assistant:

int sk_addrtype(SockAddr *addr)
{
    SockAddrStep step;
    int family;
    START_STEP(addr, step);
    family = SOCKADDR_FAMILY(addr, step);

    return (family == AF_INET ? ADDRTYPE_IPV4 :
#ifndef NO_IPV6
            family == AF_INET6 ? ADDRTYPE_IPV6 :
#endif
            ADDRTYPE_NAME);
}